

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void import_kernel_cmdline(int in_qemu)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char cmdline [1024];
  char local_438 [1032];
  
  pcVar6 = local_438;
  iVar1 = open("/proc/cmdline",0);
  if (iVar1 < 0) {
    local_438[0] = '\0';
  }
  else {
    sVar3 = read(iVar1,local_438,0x3ff);
    uVar2 = (uint)sVar3;
    uVar7 = 0;
    if ((0 < (int)uVar2) && (uVar7 = uVar2, local_438[uVar2 - 1] == '\n')) {
      uVar7 = uVar2 - 1;
    }
    local_438[(int)uVar7] = '\0';
    close(iVar1);
    pcVar6 = local_438;
  }
  do {
    if (*pcVar6 == '\0') break;
    pcVar4 = strchr(pcVar6,0x20);
    if (pcVar4 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = pcVar4 + 1;
      *pcVar4 = '\0';
    }
    pcVar4 = strchr(pcVar6,0x3d);
    if (((pcVar4 != (char *)0x0) && (*pcVar4 = '\0', in_qemu == 0)) && (*pcVar6 != '\0')) {
      iVar1 = strcmp(pcVar6,"qemu");
      if (iVar1 == 0) {
        pcVar6 = qemu;
      }
      else {
        iVar1 = strcmp(pcVar6,"androidboot.console");
        if (iVar1 == 0) {
          pcVar6 = console;
        }
        else {
          iVar1 = strcmp(pcVar6,"androidboot.mode");
          if (iVar1 != 0) {
            qemu_cmdline(pcVar6,pcVar4 + 1);
            goto LAB_001060dc;
          }
          pcVar6 = bootmode;
        }
      }
      strlcpy(pcVar6,pcVar4 + 1,0x20);
    }
LAB_001060dc:
    pcVar6 = pcVar5;
  } while (pcVar5 != (char *)0x0);
  chmod("/proc/cmdline",0x120);
  return;
}

Assistant:

static void import_kernel_cmdline(int in_qemu)
{
    char cmdline[1024];
    char *ptr;
    int fd;

    fd = open("/proc/cmdline", O_RDONLY);
    if (fd >= 0) {
        int n = read(fd, cmdline, 1023);
        if (n < 0) n = 0;

        /* get rid of trailing newline, it happens */
        if (n > 0 && cmdline[n-1] == '\n') n--;

        cmdline[n] = 0;
        close(fd);
    } else {
        cmdline[0] = 0;
    }

    ptr = cmdline;
    while (ptr && *ptr) {
        char *x = strchr(ptr, ' ');
        if (x != 0) *x++ = 0;
        import_kernel_nv(ptr, in_qemu);
        ptr = x;
    }

        /* don't expose the raw commandline to nonpriv processes */
    chmod("/proc/cmdline", 0440);
}